

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ConsumeInteger(Parser *this,int *output,char *error)

{
  TokenType TVar1;
  bool bVar2;
  string local_50;
  uint64 local_30;
  uint64 value;
  
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_INTEGER) {
    local_30 = 0;
    bVar2 = io::Tokenizer::ParseInteger(&(this->input_->current_).text,0x7fffffff,&local_30);
    if (!bVar2) {
      std::__cxx11::string::string
                ((string *)&local_50,"Integer out of range.",(allocator *)((long)&value + 7));
      AddError(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    *output = (int)local_30;
    io::Tokenizer::Next(this->input_);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,error,(allocator *)&local_30);
    AddError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return TVar1 == TYPE_INTEGER;
}

Assistant:

bool Parser::ConsumeInteger(int* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    uint64 value = 0;
    if (!io::Tokenizer::ParseInteger(input_->current().text, kint32max,
                                     &value)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse an integer.
    }
    *output = value;
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}